

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

void Gia_ManEraHashResize(Gia_ManEra_t *p)

{
  uint uVar1;
  uint *__ptr;
  Gia_ObjEra_t *pState;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  __ptr = p->pBins;
  if (__ptr == (uint *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                  ,0xea,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
  }
  uVar1 = p->nBins;
  uVar4 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar2 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar2 != 0);
    if (uVar5 < 9) break;
    iVar7 = 5;
    while (uVar5 % (iVar7 - 2U) != 0) {
      uVar2 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar5 < uVar2) goto LAB_007321ad;
    }
  }
LAB_007321ad:
  p->nBins = uVar5;
  puVar3 = (uint *)calloc((long)(int)uVar5,4);
  p->pBins = puVar3;
  if ((int)uVar1 < 1) {
    iVar7 = 0;
  }
  else {
    uVar6 = 0;
    iVar7 = 0;
    do {
      uVar4 = __ptr[uVar6];
      if ((ulong)uVar4 != 0) {
        if (((int)uVar4 < 0) || (p->vStates->nSize <= (int)uVar4)) {
LAB_00732295:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pState = (Gia_ObjEra_t *)p->vStates->pArray[uVar4];
        while (pState != (Gia_ObjEra_t *)0x0) {
          iVar7 = iVar7 + 1;
          if (pState->Num == 0) {
            __assert_fail("pThis->Num",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                          ,0xf8,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
          }
          uVar4 = pState->iNext;
          pState->iNext = 0;
          puVar3 = Gia_ManEraHashFind(p,pState,(int *)0x0);
          if (*puVar3 != 0) {
            __assert_fail("*piPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                          ,0xfb,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
          }
          *puVar3 = pState->Num;
          if ((ulong)uVar4 == 0) break;
          if (((int)uVar4 < 0) || (p->vStates->nSize <= (int)uVar4)) goto LAB_00732295;
          pState = (Gia_ObjEra_t *)p->vStates->pArray[uVar4];
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  if (iVar7 == p->vStates->nSize + -1) {
    free(__ptr);
    return;
  }
  __assert_fail("Counter == Vec_PtrSize( p->vStates ) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                ,0xff,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
}

Assistant:

void Gia_ManEraHashResize( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pThis;
    unsigned * pBinsOld, * piPlace;
    int nBinsOld, iNext, Counter, i;
    assert( p->pBins != NULL );
    // replace the table
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( unsigned, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pThis = (pBinsOld[i]? Gia_ManEraState(p, pBinsOld[i]) : NULL),
          iNext = (pThis? pThis->iNext : 0);  
          pThis;  pThis = (iNext? Gia_ManEraState(p, iNext) : NULL),   
          iNext = (pThis? pThis->iNext : 0)  )
    {
        assert( pThis->Num );
        pThis->iNext = 0;
        piPlace = Gia_ManEraHashFind( p, pThis, NULL );
        assert( *piPlace == 0 ); // should not be there
        *piPlace = pThis->Num;
        Counter++;
    }
    assert( Counter == Vec_PtrSize( p->vStates ) - 1 );
    ABC_FREE( pBinsOld );
}